

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O0

VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs> __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this)

{
  RangeIterator<unsigned_long> i;
  long in_RSI;
  IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RDI;
  unsigned_long in_stack_fffffffffffffe38;
  unsigned_long in_stack_fffffffffffffe40;
  unsigned_long in_stack_fffffffffffffe70;
  undefined1 *puVar1;
  undefined1 in_stack_fffffffffffffe78 [16];
  undefined1 local_138 [16];
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:60:17),_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  *in_stack_fffffffffffffed8;
  IterTraits<Lib::RangeIterator<unsigned_long>_> *in_stack_ffffffffffffff10;
  anon_class_8_1_8991fb9c_for__func in_stack_ffffffffffffff18;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>_>_>
  local_80;
  
  Lib::
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
  ::size((Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
          *)(in_RSI + 8));
  Lib::getRangeIterator<unsigned_long>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  i._from = in_stack_fffffffffffffe78._0_8_;
  i._to = in_stack_fffffffffffffe78._8_8_;
  i._next = in_stack_fffffffffffffe70;
  Lib::iterTraits<Lib::RangeIterator<unsigned_long>>(i);
  puVar1 = local_138;
  Lib::IterTraits<Lib::RangeIterator<unsigned_long>>::
  flatMap<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::_lambda(auto:1)_1_>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::{lambda(auto:1)#1},Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>>>
  ::
  flatMap<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::_lambda(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Leaf*)_1_>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>_>
              *)&stack0xffffffffffffff18,puVar1);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::{lambda(auto:1)#1},Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::{lambda(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Leaf*)#1},Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>>>>
  ::
  map<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::_lambda(Inferences::ALASCA::BinaryResolutionConf::Lhs_const*)_1_>
            (&local_80,&stack0xffffffffffffff18);
  Lib::
  pvi<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::_lambda(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Leaf*)_1_,Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>>>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getAll()::_lambda(Inferences::ALASCA::BinaryResolutionConf::Lhs_const*)_1_,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>
            (in_stack_fffffffffffffed8);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:60:17),_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:60:17),_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                 *)0x424fb0);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>_>_>
                 *)0x424fbd);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>_>_>
                 *)0x424fca);
  return (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs>)in_RDI;
}

Assistant:

VirtualIterator<LeafData> getAll() final override
  {
    return pvi(
          iterTraits(getRangeIterator((unsigned long)0, _trees.size()))
           .flatMap([this](auto i) { return LeafIterator(_trees[i].get()); })
           .flatMap([](Leaf* l) { return l->allChildren(); })
           // TODO get rid of copying data here
           .map([](LeafData const* ld) { return *ld; })
        );
  }